

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

OmegaOP * __thiscall
pybind11::detail::
argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
::
call_impl<OmegaOP*,OmegaOP*(*&)(std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string),0ul,1ul,2ul,3ul,4ul,5ul,pybind11::detail::void_type>
          (argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
           *this,undefined8 *f)

{
  undefined8 uVar1;
  undefined8 uVar2;
  code *pcVar3;
  OmegaOP *pOVar4;
  _Vector_base<double,_std::allocator<double>_> local_a8;
  _Vector_base<double,_std::allocator<double>_> local_88;
  string local_70 [32];
  string local_50 [32];
  
  pcVar3 = (code *)*f;
  local_88._M_impl.super__Vector_impl_data._M_start = *(pointer *)(this + 0x68);
  local_88._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(this + 0x70);
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(this + 0x78);
  *(undefined8 *)(this + 0x68) = 0;
  *(undefined8 *)(this + 0x70) = 0;
  *(undefined8 *)(this + 0x78) = 0;
  local_a8._M_impl.super__Vector_impl_data._M_start = *(pointer *)(this + 0x50);
  local_a8._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(this + 0x58);
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(this + 0x60);
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x58) = 0;
  uVar1 = *(undefined8 *)(this + 0x48);
  std::__cxx11::string::string(local_50,(string *)(this + 0x28));
  uVar2 = *(undefined8 *)(this + 0x20);
  std::__cxx11::string::string(local_70,(string *)this);
  pOVar4 = (OmegaOP *)(*pcVar3)((int)uVar1,(int)uVar2,&local_88,&local_a8,local_50,local_70);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
  return pOVar4;
}

Assistant:

Return call_impl(Func &&f, index_sequence<Is...>, Guard &&) {
        return std::forward<Func>(f)(cast_op<Args>(std::move(std::get<Is>(argcasters)))...);
    }